

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_short>::calculateOverlappingPairs
          (btAxisSweep3Internal<unsigned_short> *this,btDispatcher *dispatcher)

{
  btBroadphasePair *pbVar1;
  btBroadphaseProxy *proxy0;
  btBroadphaseProxy *proxy1;
  bool bVar2;
  int iVar3;
  btAlignedObjectArray<btBroadphasePair> *this_00;
  btBroadphaseProxy *pbVar4;
  btBroadphaseProxy *pbVar5;
  long lVar6;
  undefined8 *puVar7;
  long lVar8;
  btBroadphasePair local_58;
  undefined4 extraout_var;
  
  iVar3 = (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [0xe])();
  if ((char)iVar3 != '\0') {
    iVar3 = (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
              [7])();
    this_00 = (btAlignedObjectArray<btBroadphasePair> *)CONCAT44(extraout_var,iVar3);
    btAlignedObjectArray<btBroadphasePair>::quickSort<btBroadphasePairSortPredicate>
              (this_00,(btBroadphasePairSortPredicate *)&local_58);
    local_58.m_algorithm = (btCollisionAlgorithm *)0x0;
    local_58.field_3.m_internalInfo1 = (void *)0x0;
    local_58.m_pProxy0 = (btBroadphaseProxy *)0x0;
    local_58.m_pProxy1 = (btBroadphaseProxy *)0x0;
    btAlignedObjectArray<btBroadphasePair>::resize
              (this_00,this_00->m_size - this->m_invalidPair,&local_58);
    this->m_invalidPair = 0;
    lVar8 = 0;
    pbVar4 = (btBroadphaseProxy *)0x0;
    pbVar5 = (btBroadphaseProxy *)0x0;
    for (lVar6 = 0; lVar6 < this_00->m_size; lVar6 = lVar6 + 1) {
      pbVar1 = this_00->m_data;
      proxy0 = *(btBroadphaseProxy **)((long)&pbVar1->m_pProxy0 + lVar8);
      proxy1 = *(btBroadphaseProxy **)((long)&pbVar1->m_pProxy1 + lVar8);
      if (pbVar5 == proxy1 && pbVar4 == proxy0) {
LAB_0012c81d:
        puVar7 = (undefined8 *)((long)&pbVar1->m_pProxy0 + lVar8);
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[8])
                  (this->m_pairCache,puVar7,dispatcher);
        *puVar7 = 0;
        puVar7[1] = 0;
        this->m_invalidPair = this->m_invalidPair + 1;
        gOverlappingPairs = gOverlappingPairs + -1;
      }
      else {
        bVar2 = testAabbOverlap(this,proxy0,proxy1);
        if (!bVar2) goto LAB_0012c81d;
      }
      lVar8 = lVar8 + 0x20;
      pbVar4 = proxy0;
      pbVar5 = proxy1;
    }
    btAlignedObjectArray<btBroadphasePair>::quickSort<btBroadphasePairSortPredicate>
              (this_00,(btBroadphasePairSortPredicate *)&local_58);
    local_58.m_algorithm = (btCollisionAlgorithm *)0x0;
    local_58.field_3.m_internalInfo1 = (void *)0x0;
    local_58.m_pProxy0 = (btBroadphaseProxy *)0x0;
    local_58.m_pProxy1 = (btBroadphaseProxy *)0x0;
    btAlignedObjectArray<btBroadphasePair>::resize
              (this_00,this_00->m_size - this->m_invalidPair,&local_58);
    this->m_invalidPair = 0;
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::calculateOverlappingPairs(btDispatcher* dispatcher)
{

	if (m_pairCache->hasDeferredRemoval())
	{
	
		btBroadphasePairArray&	overlappingPairArray = m_pairCache->getOverlappingPairArray();

		//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;

		
		int i;

		btBroadphasePair previousPair;
		previousPair.m_pProxy0 = 0;
		previousPair.m_pProxy1 = 0;
		previousPair.m_algorithm = 0;
		
		
		for (i=0;i<overlappingPairArray.size();i++)
		{
		
			btBroadphasePair& pair = overlappingPairArray[i];

			bool isDuplicate = (pair == previousPair);

			previousPair = pair;

			bool needsRemoval = false;

			if (!isDuplicate)
			{
				///important to use an AABB test that is consistent with the broadphase
				bool hasOverlap = testAabbOverlap(pair.m_pProxy0,pair.m_pProxy1);

				if (hasOverlap)
				{
					needsRemoval = false;//callback->processOverlap(pair);
				} else
				{
					needsRemoval = true;
				}
			} else
			{
				//remove duplicate
				needsRemoval = true;
				//should have no algorithm
				btAssert(!pair.m_algorithm);
			}
			
			if (needsRemoval)
			{
				m_pairCache->cleanOverlappingPair(pair,dispatcher);

		//		m_overlappingPairArray.swap(i,m_overlappingPairArray.size()-1);
		//		m_overlappingPairArray.pop_back();
				pair.m_pProxy0 = 0;
				pair.m_pProxy1 = 0;
				m_invalidPair++;
				gOverlappingPairs--;
			} 
			
		}

	///if you don't like to skip the invalid pairs in the array, execute following code:
	#define CLEAN_INVALID_PAIRS 1
	#ifdef CLEAN_INVALID_PAIRS

		//perform a sort, to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;
	#endif//CLEAN_INVALID_PAIRS
		
		//printf("overlappingPairArray.size()=%d\n",overlappingPairArray.size());
	}

}